

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerReadFileheader(Pager *pPager,int N,uchar *pDest)

{
  int local_24;
  int rc;
  uchar *pDest_local;
  int N_local;
  Pager *pPager_local;
  
  local_24 = 0;
  memset(pDest,0,(long)N);
  if ((pPager->fd->pMethods != (sqlite3_io_methods *)0x0) &&
     (local_24 = sqlite3OsRead(pPager->fd,pDest,N,0), local_24 == 0x20a)) {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerReadFileheader(Pager *pPager, int N, unsigned char *pDest){
  int rc = SQLITE_OK;
  memset(pDest, 0, N);
  assert( isOpen(pPager->fd) || pPager->tempFile );

  /* This routine is only called by btree immediately after creating
  ** the Pager object.  There has not been an opportunity to transition
  ** to WAL mode yet.
  */
  assert( !pagerUseWal(pPager) );

  if( isOpen(pPager->fd) ){
    IOTRACE(("DBHDR %p 0 %d\n", pPager, N))
    rc = sqlite3OsRead(pPager->fd, pDest, N, 0);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }
  return rc;
}